

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-actions.h
# Opt level: O2

Result __thiscall
testing::Action<bool_(const_solitaire::archivers::interfaces::Snapshot_&)>::Perform
          (Action<bool_(const_solitaire::archivers::interfaces::Snapshot_&)> *this,
          ArgumentTuple *args)

{
  bool bVar1;
  
  if ((this->fun_).super__Function_base._M_manager == (_Manager_type)0x0) {
    internal::IllegalDoDefault
              ("/workspace/llm4binary/github/license_all_cmakelists_25/smarkuck[P]Solitaire-written-using-TDD-approach/externalLibs/googletest/googlemock/include/gmock/gmock-actions.h"
               ,0x1f0);
  }
  bVar1 = internal::
          ApplyImpl<std::function<bool(solitaire::archivers::interfaces::Snapshot_const&)>const&,std::tuple<solitaire::archivers::interfaces::Snapshot_const&>,0ul>
                    (this,args);
  return bVar1;
}

Assistant:

Result Perform(ArgumentTuple args) const {
    if (IsDoDefault()) {
      internal::IllegalDoDefault(__FILE__, __LINE__);
    }
    return internal::Apply(fun_, ::std::move(args));
  }